

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

int __thiscall
ImFontAtlas::AddCustomRectFontGlyph
          (ImFontAtlas *this,ImFont *font,ImWchar id,int width,int height,float advance_x,
          ImVec2 *offset)

{
  ImVec2 IVar1;
  int iVar2;
  CustomRect *pCVar3;
  CustomRect *__dest;
  int iVar4;
  int iVar5;
  
  IVar1 = *offset;
  iVar5 = (this->CustomRects).Size;
  iVar2 = (this->CustomRects).Capacity;
  if (iVar5 == iVar2) {
    iVar5 = iVar5 + 1;
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar2 < iVar5) {
      __dest = (CustomRect *)ImGui::MemAlloc((long)iVar5 << 5);
      pCVar3 = (this->CustomRects).Data;
      if (pCVar3 != (CustomRect *)0x0) {
        memcpy(__dest,pCVar3,(long)(this->CustomRects).Size << 5);
        ImGui::MemFree((this->CustomRects).Data);
      }
      (this->CustomRects).Data = __dest;
      (this->CustomRects).Capacity = iVar5;
    }
  }
  pCVar3 = (this->CustomRects).Data;
  iVar5 = (this->CustomRects).Size;
  pCVar3[iVar5].ID = (uint)id;
  pCVar3[iVar5].Width = (unsigned_short)width;
  pCVar3[iVar5].Height = (unsigned_short)height;
  pCVar3[iVar5].X = 0xffff;
  pCVar3[iVar5].Y = 0xffff;
  pCVar3[iVar5].GlyphAdvanceX = advance_x;
  pCVar3[iVar5].GlyphOffset = IVar1;
  pCVar3[iVar5].Font = font;
  iVar5 = (this->CustomRects).Size;
  (this->CustomRects).Size = iVar5 + 1;
  return iVar5;
}

Assistant:

int ImFontAtlas::AddCustomRectFontGlyph(ImFont* font, ImWchar id, int width, int height, float advance_x, const ImVec2& offset)
{
    IM_ASSERT(font != NULL);
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    CustomRect r;
    r.ID = id;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    r.GlyphAdvanceX = advance_x;
    r.GlyphOffset = offset;
    r.Font = font;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}